

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::set_key_tag(Tree *this,size_t node,csubstr tag)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  size_t in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  Tree *in_RDI;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  Location *in_stack_ffffffffffffff80;
  Tree *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffb8;
  Tree *in_stack_ffffffffffffffc0;
  Tree *pTVar4;
  Tree *pTVar5;
  
  pTVar4 = in_RDI;
  pTVar5 = in_RDI;
  pNVar3 = _p(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (((pNVar3->m_type).type & KEY) == NOTYPE) {
    eVar2 = get_error_flags();
    in_stack_ffffffffffffff88 = in_stack_ffffffffffffffc0;
    if (((eVar2 & 1) != 0) &&
       (bVar1 = is_debugger_attached(), in_stack_ffffffffffffff88 = in_stack_ffffffffffffffc0, bVar1
       )) {
      trap_instruction();
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffffc0;
    }
    Location::Location(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                       ,in_stack_ffffffffffffff68);
    loc.super_LineCol.line = (size_t)in_RDX;
    loc.super_LineCol.offset = (size_t)pTVar4;
    loc.super_LineCol.col = in_RCX;
    loc.name.str = (char *)in_RSI;
    loc.name.len = (size_t)pTVar5;
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffff88;
    error<28ul>((char (*) [28])in_stack_ffffffffffffff88,loc);
  }
  pNVar3 = _p(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (pNVar3->m_key).tag.str = in_RDX;
  (pNVar3->m_key).tag.len = in_RCX;
  _add_flags(in_RDI,in_stack_ffffffffffffff90,(NodeType_e)in_stack_ffffffffffffff88);
  return;
}

Assistant:

void set_key_tag(size_t node, csubstr tag) { RYML_ASSERT(has_key(node)); _p(node)->m_key.tag = tag; _add_flags(node, KEYTAG); }